

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O1

string * vectorgraphics::getStyleMapString
                   (string *__return_storage_ptr__,StyleMap *style_map,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *keys)

{
  pointer pbVar1;
  char *pcVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pointer __k;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  __k = (keys->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pbVar1) {
    do {
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&style_map->_M_t,__k);
      if ((_Rb_tree_header *)cVar3._M_node != &(style_map->_M_t)._M_impl.super__Rb_tree_header) {
        pcVar2 = (__k->_M_dataplus)._M_p;
        if (*pcVar2 != '*') {
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)pcVar2);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(style_map,__k);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(pmVar4->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      __k = __k + 1;
    } while (__k != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getStyleMapString(const StyleMap& style_map, const std::vector<std::string> keys) {
    std::string full_string{""};
    for(const auto& key : keys) {
      if(style_map.find(key) != style_map.end()) {
        if(key[0] == '*') { // starred parameters will not add the key (this is to support unique / special parameters )
          full_string += style_map.at(key);
          full_string += ",";
        }
        else {
          full_string += key;
          full_string += "=";
          full_string += style_map.at(key);
          full_string += ",";
        }
      }
    }
    return full_string;
  }